

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Min::forward_impl
          (Min *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  Tensor *pTVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  uint uVar8;
  Index size_1;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  Index size;
  float fVar19;
  Packet4f res;
  undefined1 auVar20 [16];
  Tensor t;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  ulong uStack_40;
  uint local_38;
  void *local_30;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_28;
  
  uVar9 = (ulong)(fx->d).nd;
  iVar12 = 1;
  iVar7 = 1;
  if (uVar9 != 0) {
    iVar7 = 1;
    uVar11 = 0;
    do {
      iVar7 = iVar7 * (fx->d).d[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = *ppTVar1;
  uVar9 = (ulong)(pTVar2->d).nd;
  if (uVar9 != 0) {
    iVar12 = 1;
    uVar11 = 0;
    do {
      iVar12 = iVar12 * (pTVar2->d).d[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  pTVar3 = ppTVar1[1];
  uVar9 = (ulong)(pTVar3->d).nd;
  iVar17 = 1;
  iVar14 = 1;
  if (uVar9 != 0) {
    uVar11 = 0;
    do {
      iVar14 = iVar14 * (pTVar3->d).d[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  uVar8 = iVar7 * (fx->d).bd;
  uVar11 = (ulong)uVar8;
  pfVar4 = fx->v;
  pfVar5 = pTVar2->v;
  pfVar6 = pTVar3->v;
  uVar15 = iVar14 * (pTVar3->d).bd;
  local_30 = (this->super_Node).aux_mem;
  uStack_40 = *(ulong *)((fx->d).d + 6);
  local_48 = *(undefined8 *)((fx->d).d + 4);
  local_38 = (fx->d).bd;
  local_58 = *(undefined8 *)(fx->d).d;
  uStack_50 = *(undefined8 *)((fx->d).d + 2);
  local_28.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = uStack_40 >> 0x20;
  if (uVar9 != 0) {
    iVar17 = 1;
    uVar10 = 0;
    do {
      iVar17 = iVar17 * *(int *)((long)&local_58 + uVar10 * 4);
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if (iVar12 * (pTVar2->d).bd == uVar15) {
    uVar18 = iVar17 * local_38;
    if (uVar18 == uVar15) {
      if ((ulong)uVar18 != 0) {
        uVar9 = 0;
        do {
          *(uint *)((long)local_30 + uVar9 * 4) =
               -(uint)(pfVar5[uVar9] < pfVar6[uVar9]) & 0x3f800000;
          uVar9 = uVar9 + 1;
        } while (uVar18 != uVar9);
      }
      if (uVar8 == uVar15) {
        uVar9 = uVar11;
        if ((((ulong)pfVar4 & 3) == 0) &&
           (uVar9 = (ulong)(-((uint)((ulong)pfVar4 >> 2) & 0x3fffffff) & 3), uVar11 <= uVar9)) {
          uVar9 = uVar11;
        }
        uVar13 = uVar11 - uVar9;
        uVar10 = uVar13 + 3;
        if (-1 < (long)uVar13) {
          uVar10 = uVar13;
        }
        if (uVar9 != 0) {
          uVar16 = 0;
          do {
            fVar19 = pfVar6[uVar16];
            if (pfVar5[uVar16] <= pfVar6[uVar16]) {
              fVar19 = pfVar5[uVar16];
            }
            pfVar4[uVar16] = fVar19;
            uVar16 = uVar16 + 1;
          } while (uVar9 != uVar16);
        }
        uVar10 = (uVar10 & 0xfffffffffffffffc) + uVar9;
        if (3 < (long)uVar13) {
          do {
            auVar20 = minps(*(undefined1 (*) [16])(pfVar6 + uVar9),
                            *(undefined1 (*) [16])(pfVar5 + uVar9));
            *(undefined1 (*) [16])(pfVar4 + uVar9) = auVar20;
            uVar9 = uVar9 + 4;
          } while ((long)uVar9 < (long)uVar10);
        }
        if ((long)uVar10 < (long)uVar11) {
          do {
            fVar19 = pfVar6[uVar10];
            if (pfVar5[uVar10] <= pfVar6[uVar10]) {
              fVar19 = pfVar5[uVar10];
            }
            pfVar4[uVar10] = fVar19;
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
        }
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_28);
        return;
      }
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float, float, Eigen::internal::cmp_LT>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_cmp_op<float, float, Eigen::internal::cmp_LT>, Lhs = const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>]"
               );
}

Assistant:

void Min::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Min not yet implemented for CUDA");
#else
  auto y = fx.vec();
  auto x1 = xs[0]->vec();
  auto x2 = xs[1]->vec();
  Tensor t(fx.d, static_cast<float*>(aux_mem));
  auto u = t.vec();
  u = (x1.array() < x2.array()).matrix().cast<float>();
  y = x1.cwiseMin(x2);
#endif
}